

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

Image * rw::gl3::rasterToImage(Raster *raster)

{
  uint8 *puVar1;
  FILE *__stream;
  Image *this;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  int32 depth;
  code *pcVar7;
  int iVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  Error _e;
  
  puVar1 = raster->pixels;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  if (*(char *)((long)&raster->width + (long)nativeRasterOffset) == '\x01') {
    uVar6 = 0x2ec;
  }
  else {
    uVar4 = (raster->format & 0xf00U) - 0x100 >> 8;
    if (uVar4 == 0) {
      depth = 0x10;
      pcVar7 = conv_ARGB1555_from_RGBA5551;
    }
    else if (uVar4 == 5) {
      depth = 0x18;
      pcVar7 = conv_RGB888_from_RGB888;
    }
    else {
      if (uVar4 != 4) {
        uVar6 = 0x304;
        goto LAB_00115310;
      }
      depth = 0x20;
      pcVar7 = conv_RGBA8888_from_RGBA8888;
    }
    if ((raster->format & 0x6000U) == 0) {
      this = Image::create(raster->width,raster->height,depth);
      Image::allocate(this);
      uVar2 = (ulong)this->height;
      puVar9 = this->pixels + (long)this->stride * (uVar2 - 1);
      for (iVar5 = 0; iVar5 < (int)uVar2; iVar5 = iVar5 + 1) {
        puVar10 = puVar9;
        for (iVar8 = 0; iVar8 < this->width; iVar8 = iVar8 + 1) {
          (*pcVar7)(puVar10);
          puVar10 = puVar10 + this->bpp;
        }
        puVar9 = puVar9 + -(long)this->stride;
        uVar2 = (ulong)(uint)this->height;
      }
      if (puVar1 != (uint8 *)0x0) {
        return this;
      }
      Raster::unlock(raster,0);
      return this;
    }
    uVar6 = 0x30a;
  }
LAB_00115310:
  _e.plugin = 0xb00;
  _e.code = 0x8000000a;
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",uVar6
         );
  __stream = _stderr;
  pcVar3 = dbgsprint(0x8000000a);
  fprintf(__stream,"%s\n",pcVar3);
  setError(&_e);
  return (Image *)0x0;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	if(natras->isCompressed){
		// TODO
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_RGBA5551;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_RGBA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_RGB888;
		break;

	default:
	case Raster::C555:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	if(raster->format & Raster::PAL4 ||
	   raster->format & Raster::PAL8){
		RWERROR((ERR_INVRASTER));
		return nil;
	}
		
	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}

	if(unlock)
		raster->unlock(0);

	return image;
}